

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  cmOutputConverter *this_00;
  pointer ppcVar1;
  pointer puVar2;
  cmState *this_01;
  cmGlobalUnixMakefileGenerator3 *pcVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  pointer ppcVar7;
  string *psVar8;
  ostream *poVar9;
  mapped_type *pmVar10;
  ProgressMapType *this_02;
  char *pcVar11;
  pointer puVar12;
  cmGeneratorTarget *gtarget;
  cmGlobalUnixMakefileGenerator3 *local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string localName;
  string makeTargetName;
  string makefileName;
  string tmp;
  string local_270;
  EchoProgress progress;
  string name;
  string local_1c8;
  ostringstream progressArg;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  localName.field_2._M_local_buf[0] = '\0';
  makeTargetName._M_dataplus._M_p = (pointer)&makeTargetName.field_2;
  makeTargetName._M_string_length = 0;
  makeTargetName.field_2._M_local_buf[0] = '\0';
  local_350 = this;
  WriteDirectoryRules2(this,ruleFileStream,lg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&progressArg,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&progress);
  bVar4 = cmGlobalGenerator::GlobalSettingIsOn
                    ((cmGlobalGenerator *)local_350,(string *)&progressArg);
  std::__cxx11::string::~string((string *)&progressArg);
  if (!bVar4) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  ppcVar7 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_02 = &local_350->ProgressMap;
  this_00 = &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  do {
    if (ppcVar7 == ppcVar1) {
      std::__cxx11::string::~string((string *)&makeTargetName);
      std::__cxx11::string::~string((string *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      return;
    }
    gtarget = *ppcVar7;
    TVar6 = cmGeneratorTarget::GetType(gtarget);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(gtarget);
    std::__cxx11::string::string((string *)&name,(string *)psVar8);
    if ((TVar6 < GLOBAL_TARGET) && (name._M_string_length != 0)) {
      makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
      makefileName._M_string_length = 0;
      makefileName.field_2._M_local_buf[0] = '\0';
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)&progressArg,lg,gtarget);
      std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::_M_assign((string *)&makefileName);
      std::__cxx11::string::append((char *)&makefileName);
      cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
      poVar9 = std::operator<<(ruleFileStream,"# Target rules for target ");
      poVar9 = std::operator<<(poVar9,(string *)&localName);
      std::operator<<(poVar9,"\n\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::__cxx11::string::_M_assign((string *)&makeTargetName);
      std::__cxx11::string::append((char *)&makeTargetName);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)&progressArg,lg,&makefileName,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::_M_assign((string *)&makeTargetName);
      std::__cxx11::string::append((char *)&makeTargetName);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)&progressArg,lg,&makefileName,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::append((char *)&localName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      progress.Dir._M_string_length = 0;
      progress.Dir.field_2._M_local_buf[0] = '\0';
      progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
      progress.Arg._M_string_length = 0;
      progress.Arg.field_2._M_local_buf[0] = '\0';
      cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
      std::__cxx11::string::_M_assign((string *)&progress);
      std::__cxx11::string::append((char *)&progress);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
      pcVar3 = local_350;
      pmVar10 = std::
                map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
                ::operator[](this_02,&gtarget);
      puVar2 = (pmVar10->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar11 = "";
      for (puVar12 = (pmVar10->Marks).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar12 != puVar2; puVar12 = puVar12 + 1) {
        poVar9 = std::operator<<((ostream *)&progressArg,pcVar11);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        pcVar11 = ",";
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&progress.Arg,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
      this_01 = (((pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)->
                State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&progressArg,"TARGET_MESSAGES",(allocator<char> *)&tmp);
      pcVar11 = cmState::GetGlobalProperty(this_01,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      if (pcVar11 == (char *)0x0) {
LAB_00316992:
        std::operator+((string *)&progressArg,"Built target ",&name);
        cmLocalUnixMakefileGenerator3::AppendEcho
                  (lg,&commands,(string *)&progressArg,EchoNormal,&progress);
        std::__cxx11::string::~string((string *)&progressArg);
      }
      else {
        bVar5 = cmSystemTools::IsOn(pcVar11);
        if (bVar5) goto LAB_00316992;
      }
      AppendGlobalTargetDepends(local_350,&depends,gtarget);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"All Build rule for target.",&localName,&depends,&commands,true,
                 false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
      std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
      cmsys::SystemTools::CollapseFullPath(&local_270,&progress.Dir);
      cmOutputConverter::ConvertToOutputFormat(&tmp,this_00,&local_270,SHELL);
      std::operator<<((ostream *)&progressArg,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      std::__cxx11::string::~string((string *)&local_270);
      tmp._M_string_length._0_4_ = 0;
      tmp.field_2._M_allocated_capacity = 0;
      tmp.field_2._8_8_ = &tmp._M_string_length;
      poVar9 = std::operator<<((ostream *)&progressArg," ");
      CountProgressMarksInTarget
                (local_350,gtarget,
                 (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)&tmp);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   *)&tmp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tmp,"CMakeFiles/",(allocator<char> *)&progressArg);
      std::__cxx11::string::append((char *)&tmp);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall((string *)&progressArg,lg,&tmp,&localName)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
      std::operator<<((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ");
      cmsys::SystemTools::CollapseFullPath(&local_1c8,&progress.Dir);
      cmOutputConverter::ConvertToOutputFormat(&local_270,this_00,&local_1c8,SHELL);
      std::operator<<((ostream *)&progressArg,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::operator<<((ostream *)&progressArg," 0");
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 &local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      if (!bVar4) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[25]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   (char (*) [25])"cmake_check_build_system");
      }
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)&progressArg,lg,gtarget);
      std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::append((char *)&localName);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"Build rule for subdir invocation for target.",&localName,
                 &depends,&commands,true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&localName);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"Convenience name for target.",&name,&depends,&commands,true,
                 false);
      bVar5 = cmGeneratorTarget::NeedRelinkBeforeInstall
                        (gtarget,&(lg->super_cmLocalCommonGenerator).ConfigName);
      if (bVar5) {
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)&progressArg,lg,gtarget);
        std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
        std::__cxx11::string::~string((string *)&progressArg);
        std::__cxx11::string::append((char *)&localName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&depends);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&commands);
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  ((string *)&progressArg,lg,&makefileName,&localName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   (string *)&progressArg);
        std::__cxx11::string::~string((string *)&progressArg);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"Pre-install relink rule for target.",&localName,&depends,
                   &commands,true,false);
        bVar5 = cmGlobalGenerator::IsExcluded((cmGlobalGenerator *)local_350,gtarget);
        if (!bVar5) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&depends);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&localName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&commands);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&progressArg,"preinstall",(allocator<char> *)&local_270);
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (lg,ruleFileStream,"Prepare target for install.",(string *)&progressArg,&depends
                     ,&commands,true,false);
          std::__cxx11::string::~string((string *)&progressArg);
        }
      }
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)&progressArg,lg,gtarget);
      std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      std::__cxx11::string::_M_assign((string *)&makeTargetName);
      std::__cxx11::string::append((char *)&makeTargetName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&depends);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                ((string *)&progressArg,lg,&makefileName,&makeTargetName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (string *)&progressArg);
      std::__cxx11::string::~string((string *)&progressArg);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,"clean rule for target.",&makeTargetName,&depends,&commands,true,
                 false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands);
      std::__cxx11::string::~string((string *)&tmp);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress(&progress);
      std::__cxx11::string::~string((string *)&makefileName);
    }
    std::__cxx11::string::~string((string *)&name);
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  // write the directory level rules for this local gen
  this->WriteDirectoryRules2(ruleFileStream, lg);

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // for each target Generate the rule files for each target.
  for (cmGeneratorTarget* gtarget : lg->GetGeneratorTargets()) {
    int type = gtarget->GetType();
    std::string name = gtarget->GetName();
    if (!name.empty() &&
        ((type == cmStateEnums::EXECUTABLE) ||
         (type == cmStateEnums::STATIC_LIBRARY) ||
         (type == cmStateEnums::SHARED_LIBRARY) ||
         (type == cmStateEnums::MODULE_LIBRARY) ||
         (type == cmStateEnums::OBJECT_LIBRARY) ||
         (type == cmStateEnums::UTILITY))) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makefileName = localName;
      makefileName += "/build.make";

      lg->WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = localName;
      makeTargetName += "/depend";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName, makeTargetName));

      makeTargetName = localName;
      makeTargetName += "/build";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName, makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = lg->GetBinaryDirectory();
      progress.Dir += "/CMakeFiles";
      {
        std::ostringstream progressArg;
        const char* sep = "";
        for (unsigned long progFile : this->ProgressMap[gtarget].Marks) {
          progressArg << sep << progFile;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (const char* tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = cmSystemTools::IsOn(tgtMsg);
      }

      if (targetMessages) {
        lg->AppendEcho(commands, "Built target " + name,
                       cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget);
      lg->WriteMakeRule(ruleFileStream, "All Build rule for target.",
                        localName, depends, commands, true);

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " " << this->CountProgressMarksInTarget(gtarget, emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = "CMakeFiles/";
      tmp += "Makefile2";
      commands.push_back(lg->GetRecursiveMakeCall(tmp, localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      if (regenerate) {
        depends.emplace_back("cmake_check_build_system");
      }
      localName = lg->GetRelativeTargetDirectory(gtarget);
      localName += "/rule";
      lg->WriteMakeRule(ruleFileStream,
                        "Build rule for subdir invocation for target.",
                        localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      lg->WriteMakeRule(ruleFileStream, "Convenience name for target.", name,
                        depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg->GetConfigName())) {
        localName = lg->GetRelativeTargetDirectory(gtarget);
        localName += "/preinstall";
        depends.clear();
        commands.clear();
        commands.push_back(lg->GetRecursiveMakeCall(makefileName, localName));
        lg->WriteMakeRule(ruleFileStream,
                          "Pre-install relink rule for target.", localName,
                          depends, commands, true);

        if (!this->IsExcluded(gtarget)) {
          depends.clear();
          depends.push_back(localName);
          commands.clear();
          lg->WriteMakeRule(ruleFileStream, "Prepare target for install.",
                            "preinstall", depends, commands, true);
        }
      }

      // add the clean rule
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makeTargetName = localName;
      makeTargetName += "/clean";
      depends.clear();
      commands.clear();
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName, makeTargetName));
      lg->WriteMakeRule(ruleFileStream, "clean rule for target.",
                        makeTargetName, depends, commands, true);
      commands.clear();
    }
  }
}